

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void lex_next(Lexer *lxr)

{
  char *pcVar1;
  char *__s;
  long lVar2;
  int in_EAX;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  uint64_t uVar7;
  int *piVar8;
  Err *err;
  ulonglong uVar9;
  byte bVar10;
  undefined **ppuVar11;
  char cVar12;
  long lVar13;
  long lVar14;
  size_t length;
  char *ident;
  double dVar15;
  undefined1 auVar16 [16];
  int local_38 [2];
  
  pcVar1 = lxr->code;
  iVar4 = lxr->line;
  uVar5 = (ulong)(uint)lxr->cursor;
LAB_00104aa0:
  (lxr->tk).line = iVar4;
  iVar3 = (int)uVar5;
  (lxr->tk).start = iVar3;
  (lxr->tk).field_4.num = 0.0;
  lVar14 = (long)iVar3;
  bVar10 = pcVar1[lVar14];
  local_38[0] = in_EAX;
  switch(bVar10) {
  case 0:
    (lxr->tk).type = 0x119;
    (lxr->tk).length = 0;
    return;
  default:
    goto LAB_00104dd6;
  case 9:
  case 10:
  case 0xd:
  case 0x20:
    goto switchD_00104ac4_caseD_9;
  case 0x21:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 != '=') break;
    (lxr->tk).type = 0x107;
    goto LAB_00104dd2;
  case 0x25:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x105;
      goto LAB_00104dd2;
    }
    break;
  case 0x26:
    cVar12 = pcVar1[lVar14 + 1];
    break;
  case 0x2a:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x103;
      goto LAB_00104dd2;
    }
    break;
  case 0x2b:
    cVar12 = pcVar1[lVar14 + 1];
    goto LAB_00104d7c;
  case 0x2d:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x102;
      goto LAB_00104dd2;
    }
    break;
  case 0x2e:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '.') {
      (lxr->tk).type = 0x100;
      goto LAB_00104dd2;
    }
LAB_00104d7c:
    if (cVar12 != '=') break;
    (lxr->tk).type = 0x101;
    goto LAB_00104dd2;
  case 0x2f:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x104;
      goto LAB_00104dd2;
    }
    break;
  case 0x30:
    uVar5 = (ulong)((byte)pcVar1[lVar14 + 1] - 0x42);
    if ((byte)pcVar1[lVar14 + 1] - 0x42 < 0x37) {
      if ((0x100000001U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x200000002000U >> (uVar5 & 0x3f) & 1) != 0) {
          iVar4 = 8;
          goto LAB_00104dfb;
        }
        if ((0x40000000400000U >> (uVar5 & 0x3f) & 1) == 0) goto switchD_00104ac4_caseD_31;
        iVar4 = 0x10;
      }
      else {
        iVar4 = 2;
LAB_00104dfb:
        lxr->cursor = iVar3 + 2;
      }
      piVar8 = __errno_location();
      *piVar8 = 0;
      iVar3 = lxr->cursor;
      uVar9 = strtoull(pcVar1 + iVar3,(char **)local_38,iVar4);
      if (*piVar8 == 0) {
        (lxr->tk).type = 0x115;
        local_38[0] = local_38[0] - (int)(pcVar1 + iVar3);
        auVar16._8_4_ = (int)(uVar9 >> 0x20);
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = 0x45300000;
        (lxr->tk).length = local_38[0];
        (lxr->tk).field_4.num =
             (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
        lxr->cursor = lxr->cursor + local_38[0];
        return;
      }
      goto LAB_00104d25;
    }
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_00104ac4_caseD_31:
    piVar8 = __errno_location();
    *piVar8 = 0;
    iVar4 = lxr->cursor;
    dVar15 = strtod(pcVar1 + iVar4,(char **)local_38);
    if (*piVar8 == 0) {
      (lxr->tk).type = 0x115;
      local_38[0] = local_38[0] - (int)(pcVar1 + iVar4);
      (lxr->tk).length = local_38[0];
      (lxr->tk).field_4.num = dVar15;
      lxr->cursor = lxr->cursor + local_38[0];
      return;
    }
LAB_00104d25:
    err = err_new("failed to parse number");
    err->line = (lxr->tk).line;
    err_file(err,lxr->path);
    err_trigger(lxr->vm,err);
    return;
  case 0x3c:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x108;
      goto LAB_00104dd2;
    }
    break;
  case 0x3d:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x106;
      goto LAB_00104dd2;
    }
    break;
  case 0x3e:
    cVar12 = pcVar1[lVar14 + 1];
    if (cVar12 == '=') {
      (lxr->tk).type = 0x109;
      goto LAB_00104dd2;
    }
    break;
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
    lVar13 = 0;
    while (((iVar4 = (int)lVar13, bVar10 == 0x5f || (0xf5 < (byte)(bVar10 - 0x3a))) ||
           (0xe5 < (byte)((bVar10 & 0xdf) + 0xa5)))) {
      lxr->cursor = iVar3 + 1 + iVar4;
      lVar2 = lVar13 + lVar14 + 1;
      lVar13 = lVar13 + 1;
      bVar10 = pcVar1[lVar2];
    }
    (lxr->tk).length = iVar4;
    length = (size_t)iVar4;
    ppuVar11 = &lex_ident_keywords;
    lVar13 = 0;
    while( true ) {
      if (lVar13 == 0x2c) {
        (lxr->tk).type = 0x114;
        uVar7 = hash_string(pcVar1 + lVar14,length);
        (lxr->tk).field_4.ident_hash = uVar7;
        return;
      }
      __s = *ppuVar11;
      sVar6 = strlen(__s);
      if ((sVar6 == length) && (iVar4 = strncmp(pcVar1 + lVar14,__s,length), iVar4 == 0)) break;
      lVar13 = lVar13 + 4;
      ppuVar11 = ppuVar11 + 1;
    }
    (lxr->tk).type = *(Tk *)((long)&lex_ident_keyword_tks + lVar13);
    return;
  case 0x7c:
    cVar12 = pcVar1[lVar14 + 1];
    bVar10 = 0x7c;
    goto LAB_00104dc6;
  }
  if (cVar12 == '&') {
    (lxr->tk).type = 0x10a;
  }
  else {
LAB_00104dc6:
    if (cVar12 != '|') {
LAB_00104dd6:
      (lxr->tk).type = (int)(char)bVar10;
      iVar4 = 1;
      goto LAB_00104ddd;
    }
    (lxr->tk).type = 0x10b;
  }
LAB_00104dd2:
  iVar4 = 2;
LAB_00104ddd:
  (lxr->tk).length = iVar4;
  lxr->cursor = iVar3 + iVar4;
  return;
switchD_00104ac4_caseD_9:
  do {
    iVar3 = (int)uVar5;
    if (bVar10 != 9) {
      if (bVar10 != 10) {
        if (bVar10 == 0x20) goto LAB_00104adb;
        if (bVar10 != 0xd) goto LAB_00104aa0;
        if (pcVar1[(long)iVar3 + 1] == '\n') {
          iVar3 = iVar3 + 1;
        }
      }
      iVar4 = iVar4 + 1;
      lxr->line = iVar4;
    }
LAB_00104adb:
    uVar5 = (long)iVar3 + 1;
    lxr->cursor = (int)uVar5;
    bVar10 = pcVar1[(long)iVar3 + 1];
  } while( true );
}

Assistant:

void lex_next(Lexer *lxr) {
	// Copy across the current line number and start position to the token
	lxr->tk.line = lxr->line;
	lxr->tk.start = lxr->cursor;
	lxr->tk.ident_hash = 0;

	// We use so many case statements in the hope that the compiler is smart
	// enough to convert this switch into a jump table
	switch (lxr->code[lxr->cursor]) {
		// End of file
	case '\0':
		lxr->tk.type = TK_EOF;
		lxr->tk.length = 0;
		return;

		// Whitespace
	case ' ': case '\n': case '\r': case '\t':
		lex_whitespace(lxr);
		lex_next(lxr);
		return;

		// Identifier
	case 'a': case 'b': case 'c': case 'd': case 'e': case 'f': case 'g':
	case 'h': case 'i': case 'j': case 'k': case 'l': case 'm': case 'n':
	case 'o': case 'p': case 'q': case 'r': case 's': case 't': case 'u':
	case 'v': case 'w': case 'x': case 'y': case 'z':
	case 'A': case 'B': case 'C': case 'D': case 'E': case 'F': case 'G':
	case 'H': case 'I': case 'J': case 'K': case 'L': case 'M': case 'N':
	case 'O': case 'P': case 'Q': case 'R': case 'S': case 'T': case 'U':
	case 'V': case 'W': case 'X': case 'Y': case 'Z':
	case '_':
		lex_ident(lxr);
		return;

		// Number
	case '0': case '1': case '2': case '3': case '4': case '5': case '6':
	case '7': case '8': case '9':
		lex_num(lxr);
		return;

		// Multi-character symbols
	MULTI_CHAR_TK('.', '.', TK_CONCAT)

	MULTI_CHAR_TK('+', '=', TK_ADD_ASSIGN)
	MULTI_CHAR_TK('-', '=', TK_SUB_ASSIGN)
	MULTI_CHAR_TK('*', '=', TK_MUL_ASSIGN)
	MULTI_CHAR_TK('/', '=', TK_DIV_ASSIGN)
	MULTI_CHAR_TK('%', '=', TK_MOD_ASSIGN)

	MULTI_CHAR_TK('<', '=', TK_LE)
	MULTI_CHAR_TK('>', '=', TK_GE)
	MULTI_CHAR_TK('=', '=', TK_EQ)
	MULTI_CHAR_TK('!', '=', TK_NEQ)

	MULTI_CHAR_TK('&', '&', TK_AND)
	MULTI_CHAR_TK('|', '|', TK_OR)

		// Single character symbol
	default:
		lxr->tk.type = lxr->code[lxr->cursor];
		lxr->tk.length = 1;
		break;
	}

	// If we reach here, then we haven't updated the cursor position yet
	lxr->cursor += lxr->tk.length;
}